

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  ulong uVar1;
  long in_RDX;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  uint64_t Length;
  undefined4 local_3c;
  
  uVar1 = in_RSI >> 0xc & 0xf;
  if (uVar1 == 0) {
    local_3c = 0;
  }
  else {
    local_3c = *(uint *)(in_RDX + uVar1 * 4);
  }
  MCOperand_CreateReg0(in_RDI,local_3c);
  MCOperand_CreateImm0(in_RDI,in_RSI & 0xfff);
  MCOperand_CreateImm0(in_RDI,(in_RSI >> 0x10) + 1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDLAddr12Len8Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Length = Field >> 16;
	uint64_t Base = (Field >> 12) & 0xf;
	uint64_t Disp = Field & 0xfff;
	//assert(Length < 256 && "Invalid BDLAddr12Len8");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, Disp);
	MCOperand_CreateImm0(Inst, Length + 1);

	return MCDisassembler_Success;
}